

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O2

Value __thiscall Frame::getLocalVariableValue(Frame *this,uint32_t index)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  Value VVar3;
  uint32_t index_local;
  undefined1 auVar4 [12];
  
  if (index < this->_codeAttribute->max_locals) {
    pmVar1 = std::
             map<unsigned_int,_Value,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Value>_>_>
             ::operator[](&this->_localVariables,&index_local);
    VVar3.printType = pmVar1->printType;
    auVar4._4_4_ = pmVar1->type;
    VVar3.data = pmVar1->data;
    return VVar3;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Tentando acessar variavel local inexistente");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

Value Frame::getLocalVariableValue(uint32_t index) {
    if (index >= _codeAttribute->max_locals) {
        cerr << "Tentando acessar variavel local inexistente" << endl;
        exit(1);
    }
    
    return _localVariables[index];
}